

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O2

keypress inkey(void)

{
  mouseclick mVar1;
  uint uVar2;
  mouseclick mVar3;
  ui_event_type uVar4;
  uint uVar5;
  undefined4 in_EDX;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ui_event uVar10;
  keypress kVar11;
  
  mVar3.type = EVT_NONE;
  mVar3.x = '\0';
  mVar3.y = '\0';
  mVar3.button = '\0';
  mVar3.mods = '\0';
  uVar7 = 0;
  uVar9 = 0;
  uVar2 = 0;
  while( true ) {
    uVar4 = mVar3.type;
    if (uVar4 == EVT_KBRD) break;
    if (uVar4 == EVT_MOUSE) {
      uVar5 = 0xe000;
      if ((char)uVar9 == '\x01') {
        uVar5 = 10;
      }
LAB_001c4170:
      uVar6 = 1;
      in_EDX = 0;
      uVar8 = 0;
      uVar2 = 0;
      goto LAB_001c417a;
    }
    if (uVar4 == EVT_BUTTON) break;
    if (uVar4 == EVT_ESCAPE) {
      uVar5 = 0xe000;
      goto LAB_001c4170;
    }
    uVar10 = inkey_ex();
    in_EDX = uVar10._8_4_;
    mVar3 = uVar10.mouse;
    uVar7 = (ulong)mVar3 >> 0x20;
    uVar9 = (ulong)mVar3 >> 0x30;
    uVar2 = uVar10.key.code & 0xff000000;
  }
  mVar1.type = EVT_KBRD;
  mVar1.x = '\0';
  mVar1.y = '\0';
  mVar1.button = '\0';
  mVar1.mods = '\0';
  if (uVar4 != EVT_BUTTON) {
    mVar1 = mVar3;
  }
  uVar6 = (ulong)mVar1 & 0xffffffff;
  uVar8 = ((uint)uVar9 & 0xff) << 0x10;
  uVar5 = (uint)uVar7 & 0xffff;
LAB_001c417a:
  kVar11._0_8_ = (ulong)(uVar2 | uVar5 | uVar8) << 0x20 | uVar6;
  kVar11._8_4_ = in_EDX;
  return kVar11;
}

Assistant:

struct keypress inkey(void)
{
	ui_event ke = EVENT_EMPTY;

	while (ke.type != EVT_ESCAPE && ke.type != EVT_KBRD &&
		   ke.type != EVT_MOUSE && ke.type != EVT_BUTTON)
		ke = inkey_ex();

	/* Make the event a keypress */
	if (ke.type == EVT_ESCAPE) {
		ke.type = EVT_KBRD;
		ke.key.code = ESCAPE;
		ke.key.mods = 0;
	} else if (ke.type == EVT_MOUSE) {
		if (ke.mouse.button == 1) {
			ke.type = EVT_KBRD;
			ke.key.code = '\n';
			ke.key.mods = 0;
		} else {
			ke.type = EVT_KBRD;
			ke.key.code = ESCAPE;
			ke.key.mods = 0;
		}
	} else if (ke.type == EVT_BUTTON) {
		ke.type = EVT_KBRD;
	}

	return ke.key;
}